

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runxmlconf.c
# Opt level: O0

int xmlconfTestNotNSWF(char *id,char *filename,int options)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  int local_2c;
  int ret;
  xmlDocPtr doc;
  int options_local;
  char *filename_local;
  char *id_local;
  
  local_2c = 1;
  lVar1 = xmlReadFile(filename,0,options);
  if (lVar1 != 0) {
    lVar2 = __xmlLastError();
    if ((*(int *)(lVar2 + 4) == 0) || (piVar3 = (int *)__xmlLastError(), *piVar3 != 3)) {
      test_log("test %s : %s failed to detect namespace error\n",id,filename);
      nb_errors = nb_errors + 1;
      local_2c = 0;
    }
    xmlFreeDoc(lVar1);
    return local_2c;
  }
  test_log("test %s : %s failed to parse the XML\n",id,filename);
  nb_errors = nb_errors + 1;
  return 0;
}

Assistant:

static int
xmlconfTestNotNSWF(const char *id, const char *filename, int options) {
    xmlDocPtr doc;
    int ret = 1;

    /*
     * In case of Namespace errors, libxml2 will still parse the document
     * but log a Namespace error.
     */
    doc = xmlReadFile(filename, NULL, options);
    if (doc == NULL) {
        test_log("test %s : %s failed to parse the XML\n",
	         id, filename);
        nb_errors++;
	ret = 0;
    } else {
	if ((xmlLastError.code == XML_ERR_OK) ||
	    (xmlLastError.domain != XML_FROM_NAMESPACE)) {
	    test_log("test %s : %s failed to detect namespace error\n",
		     id, filename);
	    nb_errors++;
	    ret = 0;
	}
	xmlFreeDoc(doc);
    }
    return(ret);
}